

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O0

int sengr_at(char *s,xchar x,xchar y)

{
  engr *peVar1;
  char *pcVar2;
  bool local_21;
  engr *ep;
  xchar y_local;
  xchar x_local;
  char *s_local;
  
  peVar1 = engr_at(level,x,y);
  local_21 = false;
  if (((peVar1 != (engr *)0x0) && (local_21 = false, peVar1->engr_type != '\x06')) &&
     (local_21 = false, peVar1->engr_time <= (long)(ulong)moves)) {
    pcVar2 = strstri(peVar1->engr_txt,s);
    local_21 = pcVar2 != (char *)0x0;
  }
  return (int)local_21;
}

Assistant:

int sengr_at(const char *s, xchar x, xchar y)
{
	struct engr *ep = engr_at(level, x,y);

	return (ep && ep->engr_type != HEADSTONE &&
		ep->engr_time <= moves && strstri(ep->engr_txt, s) != 0);
}